

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzpermutation.cpp
# Opt level: O2

void __thiscall TPZPermutation::TPZPermutation(TPZPermutation *this,int n)

{
  int *piVar1;
  uint in_EAX;
  ulong uVar2;
  ulong uVar3;
  undefined8 local_28;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZPermutation_01648c48;
  local_28 = (ulong)in_EAX;
  TPZManVector<int,_10>::TPZManVector(&this->fCounter,(long)n,(int *)((long)&local_28 + 4));
  local_28 = CONCAT44(local_28._4_4_,0xffffffff);
  TPZManVector<int,_10>::TPZManVector(&this->fOrder,(long)n,(int *)&local_28);
  piVar1 = (this->fOrder).super_TPZVec<int>.fStore;
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    piVar1[uVar2] = (int)uVar2;
  }
  return;
}

Assistant:

TPZPermutation::TPZPermutation(int n) : fCounter(n,0), fOrder(n,-1)
{
	int i;
	for(i=0; i<n; i++) fOrder[i] = i;
}